

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::Update
          (RowGroupCollection *this,TransactionData transaction,row_t *ids,
          vector<duckdb::PhysicalIndex,_true> *column_ids,DataChunk *updates)

{
  long *plVar1;
  idx_t iVar2;
  ulong uVar3;
  storage_t c;
  undefined8 uVar4;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> ids_00;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  ulong uVar5;
  const_reference pvVar6;
  ColumnData *lock;
  type stats;
  long lVar7;
  size_type __n;
  long lVar8;
  ulong uVar9;
  idx_t offset;
  idx_t iVar10;
  idx_t iVar11;
  undefined1 local_60 [32];
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_40;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> local_38;
  
  local_40 = &this->row_groups;
  local_60._16_8_ = &this->stats;
  offset = 0;
  local_60._8_8_ = updates;
  local_38._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
        )(__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
          )ids;
  do {
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_40);
    ids_00._M_t.
    super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
    super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
         local_38._M_t.
         super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
         .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,
                         *(idx_t *)((long)local_38._M_t.
                                          super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                                          .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>.
                                          _M_head_impl + offset * 8));
    iVar2 = (this_01->super_SegmentBase<duckdb::RowGroup>).start;
    uVar5 = *(long *)((long)ids_00._M_t.
                            super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                            .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl +
                     offset * 8) - iVar2 & 0xfffffffffffff800;
    lVar8 = uVar5 + iVar2 + 0x800;
    lVar7 = (this_01->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
            _M_i + iVar2;
    if (lVar8 < lVar7) {
      lVar7 = lVar8;
    }
    uVar3._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
                  _M_use_count;
    uVar3._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
                  _M_weak_count;
    uVar9 = offset + 1;
    if (offset + 1 < uVar3) {
      uVar9 = uVar3;
    }
    iVar10 = offset;
    while (iVar11 = uVar9, uVar9 - 1 != iVar10) {
      plVar1 = (row_t *)((long)ids_00._M_t.
                               super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                               .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl
                        + 8) + iVar10;
      iVar11 = iVar10 + 1;
      if ((*plVar1 < (long)(uVar5 + iVar2)) || (iVar10 = iVar11, lVar7 <= *plVar1)) break;
    }
    RowGroup::Update(this_01,transaction,(DataChunk *)local_60._8_8_,
                     (row_t *)ids_00._M_t.
                              super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                              .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl,
                     offset,iVar11 - offset,column_ids);
    TableStatistics::GetLock((TableStatistics *)local_60);
    if ((column_ids->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (column_ids->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar6 = vector<duckdb::PhysicalIndex,_true>::operator[](column_ids,__n);
        c = pvVar6->index;
        unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
        ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                     *)local_60);
        lock = RowGroup::GetColumn(this_01,c);
        ColumnData::GetStatistics((ColumnData *)(local_60 + 0x18));
        stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)(local_60 + 0x18));
        TableStatistics::MergeStats
                  ((TableStatistics *)local_60._16_8_,(TableStatisticsLock *)lock,c,stats);
        uVar4 = local_60._24_8_;
        if ((BaseStatistics *)local_60._24_8_ != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics((BaseStatistics *)local_60._24_8_);
          operator_delete((void *)uVar4);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(column_ids->
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ).
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ::std::
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>::
    ~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_60);
    uVar5._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
                  _M_use_count;
    uVar5._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
                  _M_weak_count;
    offset = iVar11;
    if (uVar5 <= iVar11) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroupCollection::Update(TransactionData transaction, row_t *ids, const vector<PhysicalIndex> &column_ids,
                                DataChunk &updates) {
	D_ASSERT(updates.size() >= 1);
	idx_t pos = 0;
	do {
		idx_t start = pos;
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(ids[pos]));
		row_t base_id =
		    UnsafeNumericCast<row_t>(row_group->start + ((UnsafeNumericCast<idx_t>(ids[pos]) - row_group->start) /
		                                                 STANDARD_VECTOR_SIZE * STANDARD_VECTOR_SIZE));
		auto max_id = MinValue<row_t>(base_id + STANDARD_VECTOR_SIZE,
		                              UnsafeNumericCast<row_t>(row_group->start + row_group->count));
		for (pos++; pos < updates.size(); pos++) {
			D_ASSERT(ids[pos] >= 0);
			// check if this id still belongs to this vector in this row group
			if (ids[pos] < base_id) {
				// id is before vector start -> it does not
				break;
			}
			if (ids[pos] >= max_id) {
				// id is after the maximum id in this vector -> it does not
				break;
			}
		}
		row_group->Update(transaction, updates, ids, start, pos - start, column_ids);

		auto l = stats.GetLock();
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto column_id = column_ids[i];
			stats.MergeStats(*l, column_id.index, *row_group->GetStatistics(column_id.index));
		}
	} while (pos < updates.size());
}